

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O3

CURLcode Curl_ws_accept(Curl_easy *data,char *mem,size_t nread)

{
  curl_trc_feat *pcVar1;
  CURLcode CVar2;
  void *meta_data;
  ssize_t sVar3;
  Curl_cwriter *ws_dec_writer;
  CURLcode local_34;
  Curl_cwriter *local_30;
  
  meta_data = Curl_conn_meta_get(data->conn,"meta:proto:ws:conn");
  if (meta_data == (void *)0x0) {
    meta_data = (*Curl_ccalloc)(1,0x108);
    if (meta_data == (void *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    if ((((data->set).field_0x89f & 0x40) != 0) &&
       (((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)) &&
        (0 < Curl_trc_feat_ws.log_level)))) {
      Curl_trc_ws(data,"WS, using chunk size %zu",0xffff);
    }
    Curl_bufq_init2((bufq *)((long)meta_data + 0x60),0xffff,2,1);
    Curl_bufq_init2((bufq *)((long)meta_data + 0xa0),0xffff,2,1);
    *(undefined8 *)((long)meta_data + 0x18) = 0;
    *(undefined8 *)((long)meta_data + 8) = 0;
    *(undefined8 *)((long)meta_data + 0x10) = 0;
    *(undefined8 *)((long)meta_data + 0x2c) = 0;
    *(undefined8 *)((long)meta_data + 0x34) = 0;
    *(undefined8 *)((long)meta_data + 0x48) = 0;
    *(undefined4 *)((long)meta_data + 0x50) = 0;
    *(byte *)((long)meta_data + 0x59) = *(byte *)((long)meta_data + 0x59) & 0xfe;
    CVar2 = Curl_conn_meta_set(data->conn,"meta:proto:ws:conn",meta_data,ws_conn_dtor);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
  }
  else {
    Curl_bufq_reset((bufq *)((long)meta_data + 0x60));
    *(undefined8 *)((long)meta_data + 0x18) = 0;
    *(undefined8 *)((long)meta_data + 8) = 0;
    *(undefined8 *)((long)meta_data + 0x10) = 0;
    *(undefined8 *)((long)meta_data + 0x2c) = 0;
    *(undefined8 *)((long)meta_data + 0x34) = 0;
    *(undefined8 *)((long)meta_data + 0x48) = 0;
    *(undefined4 *)((long)meta_data + 0x50) = 0;
    *(byte *)((long)meta_data + 0x59) = *(byte *)((long)meta_data + 0x59) & 0xfe;
  }
  local_34 = Curl_rand_bytes(data,(uchar *)((long)meta_data + 0x54),4);
  if (local_34 == CURLE_OK) {
    if ((((data->set).field_0x89f & 0x40) != 0) &&
       ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)))) {
      Curl_infof(data,"Received 101, switch to WebSocket; mask %02x%02x%02x%02x",
                 (ulong)*(byte *)((long)meta_data + 0x54),(ulong)*(byte *)((long)meta_data + 0x55),
                 (ulong)*(byte *)((long)meta_data + 0x56),(ulong)*(byte *)((long)meta_data + 0x57));
    }
    local_34 = Curl_cwriter_create(&local_30,data,&ws_cw_decode,CURL_CW_CONTENT_DECODE);
    if (local_34 == CURLE_OK) {
      CVar2 = Curl_cwriter_add(data,local_30);
      local_34 = CVar2;
      if (CVar2 == CURLE_OK) {
        if (((data->set).field_0x89c & 1) == 0) {
          if (nread != 0) {
            local_34 = Curl_client_write(data,1,mem,nread);
          }
        }
        else {
          sVar3 = Curl_bufq_write((bufq *)((long)meta_data + 0x60),(uchar *)mem,nread,&local_34);
          if (sVar3 < 0) {
            return local_34;
          }
          if ((((data->set).field_0x89f & 0x40) != 0) &&
             ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 ||
              (0 < pcVar1->log_level)))) {
            Curl_infof(data,"%zu bytes websocket payload",nread);
          }
        }
        (data->req).upgr101 = UPGR101_RECEIVED;
      }
      else {
        Curl_cwriter_free(data,local_30);
        local_34 = CVar2;
      }
    }
  }
  return local_34;
}

Assistant:

CURLcode Curl_ws_accept(struct Curl_easy *data,
                        const char *mem, size_t nread)
{
  struct SingleRequest *k = &data->req;
  struct websocket *ws;
  struct Curl_cwriter *ws_dec_writer;
  CURLcode result;

  DEBUGASSERT(data->conn);
  ws = Curl_conn_meta_get(data->conn, CURL_META_PROTO_WS_CONN);
  if(!ws) {
    size_t chunk_size = WS_CHUNK_SIZE;
    ws = calloc(1, sizeof(*ws));
    if(!ws)
      return CURLE_OUT_OF_MEMORY;
#ifdef DEBUGBUILD
    {
      const char *p = getenv("CURL_WS_CHUNK_SIZE");
      if(p) {
        curl_off_t l;
        if(!Curl_str_number(&p, &l, 1*1024*1024))
          chunk_size = (size_t)l;
      }
    }
#endif
    CURL_TRC_WS(data, "WS, using chunk size %zu", chunk_size);
    Curl_bufq_init2(&ws->recvbuf, chunk_size, WS_CHUNK_COUNT,
                    BUFQ_OPT_SOFT_LIMIT);
    Curl_bufq_init2(&ws->sendbuf, chunk_size, WS_CHUNK_COUNT,
                    BUFQ_OPT_SOFT_LIMIT);
    ws_dec_init(&ws->dec);
    ws_enc_init(&ws->enc);
    result = Curl_conn_meta_set(data->conn, CURL_META_PROTO_WS_CONN,
                                ws, ws_conn_dtor);
    if(result)
      return result;
  }
  else {
    Curl_bufq_reset(&ws->recvbuf);
    ws_dec_reset(&ws->dec);
    ws_enc_reset(&ws->enc);
  }
  /* Verify the Sec-WebSocket-Accept response.

     The sent value is the base64 encoded version of a SHA-1 hash done on the
     |Sec-WebSocket-Key| header field concatenated with
     the string "258EAFA5-E914-47DA-95CA-C5AB0DC85B11".
  */

  /* If the response includes a |Sec-WebSocket-Extensions| header field and
     this header field indicates the use of an extension that was not present
     in the client's handshake (the server has indicated an extension not
     requested by the client), the client MUST Fail the WebSocket Connection.
  */

  /* If the response includes a |Sec-WebSocket-Protocol| header field
     and this header field indicates the use of a subprotocol that was
     not present in the client's handshake (the server has indicated a
     subprotocol not requested by the client), the client MUST Fail
     the WebSocket Connection. */

  /* 4 bytes random */

  result = Curl_rand(data, (unsigned char *)&ws->enc.mask,
                     sizeof(ws->enc.mask));
  if(result)
    return result;
  infof(data, "Received 101, switch to WebSocket; mask %02x%02x%02x%02x",
        ws->enc.mask[0], ws->enc.mask[1], ws->enc.mask[2], ws->enc.mask[3]);

  /* Install our client writer that decodes WS frames payload */
  result = Curl_cwriter_create(&ws_dec_writer, data, &ws_cw_decode,
                               CURL_CW_CONTENT_DECODE);
  if(result)
    return result;

  result = Curl_cwriter_add(data, ws_dec_writer);
  if(result) {
    Curl_cwriter_free(data, ws_dec_writer);
    return result;
  }

  if(data->set.connect_only) {
    ssize_t nwritten;
    /* In CONNECT_ONLY setup, the payloads from `mem` need to be received
     * when using `curl_ws_recv` later on after this transfer is already
     * marked as DONE. */
    nwritten = Curl_bufq_write(&ws->recvbuf, (const unsigned char *)mem,
                               nread, &result);
    if(nwritten < 0)
      return result;
    infof(data, "%zu bytes websocket payload", nread);
  }
  else { /* !connect_only */
    /* And pass any additional data to the writers */
    if(nread) {
      result = Curl_client_write(data, CLIENTWRITE_BODY, mem, nread);
    }
  }
  k->upgr101 = UPGR101_RECEIVED;

  return result;
}